

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O2

void different_stl_string_pointer_and_reference_are_not_equal(void)

{
  string *psVar1;
  Constraint *constraint;
  allocator local_31;
  string alice;
  
  psVar1 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)psVar1,"bob",(allocator *)&alice);
  bob_pointer_abi_cxx11_ = psVar1;
  std::__cxx11::string::string((string *)&alice,"alice",&local_31);
  psVar1 = bob_pointer_abi_cxx11_;
  constraint = (Constraint *)cgreen::create_not_equal_to_string_constraint((string *)&alice,"alice")
  ;
  cgreen::assert_that_<std::__cxx11::string*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x84,"bob_pointer",psVar1,constraint);
  std::__cxx11::string::~string((string *)&alice);
  return;
}

Assistant:

Ensure(different_stl_string_pointer_and_reference_are_not_equal) {
    bob_pointer = new std::string("bob");
    std::string alice("alice");

    assert_that(bob_pointer, is_not_equal_to_string(alice));
}